

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_filesystem.cpp
# Opt level: O1

void test_translate_paths(test_table *table,char *universal,char *os)

{
  uint64_t *puVar1;
  uint64_t uVar2;
  byte bVar3;
  bool bVar4;
  char *pcVar5;
  int64_t iVar6;
  
  puVar1 = table->result;
  if (puVar1 != (uint64_t *)0x0) {
    *puVar1 = 0;
  }
  pcVar5 = (*ne_filesystem_translate_universal_to_os)(puVar1,universal);
  if (table->result != (uint64_t *)0x0) {
    uVar2 = *table->result;
    bVar3 = test_validate(uVar2 == table->expected_result,uVar2,
                          "/workspace/llm4binary/github/license_c_cmakelists/TrevorSundberg[P]ne/packages/test_filesystem/test_filesystem.cpp"
                          ,0x60,"TEST_EXPECT_RESULT(table->expected_result) failed\n");
    table->success = table->success & bVar3;
  }
  iVar6 = test_string_compare(pcVar5,os);
  bVar3 = test_validate(iVar6 == 0,0,
                        "/workspace/llm4binary/github/license_c_cmakelists/TrevorSundberg[P]ne/packages/test_filesystem/test_filesystem.cpp"
                        ,0x61,"TEST_EXPECT(test_string_compare(test_os, os) == 0) failed\n");
  table->success = table->success & bVar3;
  bVar4 = validate_any_path(pcVar5);
  bVar3 = test_validate(bVar4,0,
                        "/workspace/llm4binary/github/license_c_cmakelists/TrevorSundberg[P]ne/packages/test_filesystem/test_filesystem.cpp"
                        ,0x62,"TEST_EXPECT(validate_any_path(test_os)) failed\n");
  table->success = table->success & bVar3;
  puVar1 = table->result;
  if (puVar1 != (uint64_t *)0x0) {
    *puVar1 = 0;
  }
  (*ne_core_free)(puVar1,pcVar5);
  if (table->result != (uint64_t *)0x0) {
    uVar2 = *table->result;
    bVar3 = test_validate(uVar2 == table->expected_result,uVar2,
                          "/workspace/llm4binary/github/license_c_cmakelists/TrevorSundberg[P]ne/packages/test_filesystem/test_filesystem.cpp"
                          ,0x66,"TEST_EXPECT_RESULT(table->expected_result) failed\n");
    table->success = table->success & bVar3;
  }
  puVar1 = table->result;
  if (puVar1 != (uint64_t *)0x0) {
    *puVar1 = 0;
  }
  pcVar5 = (*ne_filesystem_translate_os_to_universal)(puVar1,os);
  if (table->result != (uint64_t *)0x0) {
    uVar2 = *table->result;
    bVar3 = test_validate(uVar2 == table->expected_result,uVar2,
                          "/workspace/llm4binary/github/license_c_cmakelists/TrevorSundberg[P]ne/packages/test_filesystem/test_filesystem.cpp"
                          ,0x6b,"TEST_EXPECT_RESULT(table->expected_result) failed\n");
    table->success = table->success & bVar3;
  }
  iVar6 = test_string_compare(pcVar5,universal);
  bVar3 = test_validate(iVar6 == 0,0,
                        "/workspace/llm4binary/github/license_c_cmakelists/TrevorSundberg[P]ne/packages/test_filesystem/test_filesystem.cpp"
                        ,0x6c,
                        "TEST_EXPECT(test_string_compare(test_universal, universal) == 0) failed\n")
  ;
  table->success = table->success & bVar3;
  bVar4 = validate_universal_canonical_path(pcVar5);
  bVar3 = test_validate(bVar4,0,
                        "/workspace/llm4binary/github/license_c_cmakelists/TrevorSundberg[P]ne/packages/test_filesystem/test_filesystem.cpp"
                        ,0x6d,
                        "TEST_EXPECT(validate_universal_canonical_path(test_universal)) failed\n");
  table->success = table->success & bVar3;
  puVar1 = table->result;
  if (puVar1 != (uint64_t *)0x0) {
    *puVar1 = 0;
  }
  (*ne_core_free)(puVar1,pcVar5);
  if (table->result != (uint64_t *)0x0) {
    uVar2 = *table->result;
    bVar3 = test_validate(uVar2 == table->expected_result,uVar2,
                          "/workspace/llm4binary/github/license_c_cmakelists/TrevorSundberg[P]ne/packages/test_filesystem/test_filesystem.cpp"
                          ,0x71,"TEST_EXPECT_RESULT(table->expected_result) failed\n");
    table->success = table->success & bVar3;
  }
  return;
}

Assistant:

static void test_translate_paths(test_table *table,
                                 const char *universal,
                                 const char *os)
{
  TEST_CLEAR_RESULT();
  char *test_os =
      ne_filesystem_translate_universal_to_os(table->result, universal);
  TEST_EXPECT_TABLE_RESULT();
  TEST_EXPECT(test_string_compare(test_os, os) == 0);
  TEST_EXPECT(validate_any_path(test_os));

  TEST_CLEAR_RESULT();
  ne_core_free(table->result, test_os);
  TEST_EXPECT_TABLE_RESULT();

  TEST_CLEAR_RESULT();
  char *test_universal =
      ne_filesystem_translate_os_to_universal(table->result, os);
  TEST_EXPECT_TABLE_RESULT();
  TEST_EXPECT(test_string_compare(test_universal, universal) == 0);
  TEST_EXPECT(validate_universal_canonical_path(test_universal));

  TEST_CLEAR_RESULT();
  ne_core_free(table->result, test_universal);
  TEST_EXPECT_TABLE_RESULT();
}